

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void common_kv_cache_dump_view(llama_kv_cache_view *view,int row_size)

{
  undefined8 in_RAX;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int i;
  uint uVar4;
  llama_seq_id *plVar5;
  
  printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d"
         ,(ulong)(uint)view->n_cells,(ulong)(uint)view->n_seq_max,(ulong)(uint)view->used_cells,
         (ulong)(uint)view->token_count,(ulong)(uint)view->max_contiguous,
         CONCAT44((int)((ulong)in_RAX >> 0x20),view->max_contiguous_idx));
  plVar5 = view->cells_sequences;
  for (uVar4 = 0; (int)uVar4 < view->n_cells; uVar4 = uVar4 + 1) {
    if ((int)uVar4 % row_size == 0) {
      printf("\n%5d: ",(ulong)uVar4);
    }
    uVar1 = 0;
    uVar3 = (ulong)(uint)view->n_seq_max;
    if (view->n_seq_max < 1) {
      uVar3 = uVar1;
    }
    uVar2 = 0;
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      uVar2 = uVar2 - (~plVar5[uVar1] >> 0x1f);
    }
    uVar3 = (ulong)uVar2;
    if (0x3d < uVar2) {
      uVar3 = 0x3e;
    }
    putchar((int)".123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+"[uVar3]);
    plVar5 = plVar5 + view->n_seq_max;
  }
  puts("\n=== Done dumping");
  return;
}

Assistant:

void common_kv_cache_dump_view(const llama_kv_cache_view & view, int row_size) {
    static const char slot_chars[] = ".123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+";

    printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d",
        view.n_cells, view.n_seq_max, view.used_cells, view.token_count, view.max_contiguous, view.max_contiguous_idx);

    llama_kv_cache_view_cell * c_curr = view.cells;
    llama_seq_id * cs_curr = view.cells_sequences;

    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        if (i % row_size == 0) {
            printf("\n%5d: ", i);
        }
        int seq_count = 0;
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] >= 0) { seq_count++; }
        }
        putchar(slot_chars[std::min(sizeof(slot_chars) - 2, size_t(seq_count))]);
    }

    printf("\n=== Done dumping\n");
}